

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  IMkvReader *pReader;
  Colour *this;
  _Head_base<0UL,_mkvparser::Projection_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  longlong lVar4;
  VideoTrack *this_00;
  pointer __old_p;
  Colour *pCVar5;
  Colour *pCVar6;
  long stop;
  long lVar7;
  longlong pos;
  longlong size;
  char *colour_space;
  double rate;
  longlong id;
  longlong local_b8;
  longlong local_b0;
  Colour *local_a8;
  Colour *local_a0;
  _Head_base<0UL,_mkvparser::Projection_*,_false> local_98;
  longlong local_90;
  longlong local_88;
  longlong local_80;
  longlong local_78;
  longlong local_70;
  longlong local_68;
  double local_60;
  VideoTrack **local_58;
  Segment *local_50;
  longlong local_48;
  longlong local_40;
  long local_38;
  
  lVar7 = -1;
  if ((*pResult == (VideoTrack *)0x0) && (info->type == 1)) {
    local_60 = 0.0;
    pReader = pSegment->m_pReader;
    local_b8 = (info->settings).start;
    stop = (info->settings).size + local_b8;
    local_a0 = (Colour *)0x0;
    local_98._M_head_impl = (Projection *)0x0;
    local_68 = 0;
    local_70 = 0;
    local_78 = 0;
    local_80 = 0;
    local_88 = 0;
    local_90 = 0;
    pCVar6 = (Colour *)0x0;
    local_58 = pResult;
    local_50 = pSegment;
    local_48 = element_start;
    local_40 = element_size;
    do {
      if (stop <= local_b8) {
        lVar7 = -2;
        if (local_b8 != stop) goto LAB_00160c9e;
        this_00 = (VideoTrack *)operator_new(0x110,(nothrow_t *)&std::nothrow);
        lVar7 = -1;
        if (this_00 == (VideoTrack *)0x0) goto LAB_00160c9e;
        VideoTrack(this_00,local_50,local_48,local_40);
        iVar3 = Track::Info::Copy(info,&(this_00->super_Track).m_info);
        pCVar5 = local_a0;
        if (iVar3 != 0) {
          (*(this_00->super_Track)._vptr_Track[1])(this_00);
          goto LAB_00160c9e;
        }
        this_00->m_width = local_90;
        this_00->m_height = local_88;
        this_00->m_display_width = local_80;
        this_00->m_display_height = local_78;
        this_00->m_display_unit = local_70;
        this_00->m_stereo_mode = local_68;
        this_00->m_rate = local_60;
        local_a0 = (Colour *)0x0;
        this_00->m_colour = pCVar5;
        this_00->m_colour_space = (char *)pCVar6;
        this_00->m_projection = local_98._M_head_impl;
        *local_58 = this_00;
        lVar7 = 0;
        pCVar6 = (Colour *)0x0;
        goto LAB_00160cbe;
      }
      lVar7 = ParseElementHeader(pReader,&local_b8,stop,&local_38,&local_b0);
      if (lVar7 < 0) goto LAB_00160c9e;
      pCVar5 = pCVar6;
      if (local_38 < 0x54ba) {
        if (local_38 < 0x53b8) {
          if (local_38 == 0xb0) {
            local_90 = UnserializeUInt(pReader,local_b8,local_b0);
            lVar4 = local_90;
joined_r0x00160b6e:
            if (lVar4 < 1) break;
          }
          else if (local_38 == 0xba) {
            local_88 = UnserializeUInt(pReader,local_b8,local_b0);
            lVar4 = local_88;
            goto joined_r0x00160ab4;
          }
        }
        else {
          if (local_38 == 0x53b8) {
            local_68 = UnserializeUInt(pReader,local_b8,local_b0);
            lVar4 = local_68;
          }
          else {
            if (local_38 == 0x54b0) {
              local_80 = UnserializeUInt(pReader,local_b8,local_b0);
              lVar4 = local_80;
joined_r0x00160ab4:
              if (0 < lVar4) goto LAB_00160c22;
              break;
            }
            if (local_38 != 0x54b2) goto LAB_00160c22;
            local_70 = UnserializeUInt(pReader,local_b8,local_b0);
            lVar4 = local_70;
          }
          if (lVar4 < 0) break;
        }
      }
      else if (local_38 < 0x7670) {
        if (local_38 == 0x54ba) {
          local_78 = UnserializeUInt(pReader,local_b8,local_b0);
          lVar4 = local_78;
          goto joined_r0x00160b6e;
        }
        if (local_38 == 0x55b0) {
          local_a8 = (Colour *)0x0;
          bVar2 = Colour::Parse(pReader,local_b8,local_b0,&local_a8);
          this = local_a0;
          if (!bVar2) break;
          local_a0 = local_a8;
          if (this != (Colour *)0x0) {
            Colour::~Colour(this);
            operator_delete(this);
          }
        }
      }
      else if (local_38 == 0x7670) {
        local_a8 = (Colour *)0x0;
        bVar2 = Projection::Parse(pReader,local_b8,local_b0,(Projection **)&local_a8);
        if (!bVar2) break;
        std::__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
        reset((__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *
              )&local_98,(pointer)local_a8);
      }
      else if (local_38 == 0x2383e3) {
        lVar7 = UnserializeFloat(pReader,local_b8,local_b0,&local_60);
        if (lVar7 < 0) goto LAB_00160c9e;
        if (local_60 <= 0.0) break;
      }
      else if (local_38 == 0x2eb524) {
        local_a8 = (Colour *)0x0;
        lVar7 = UnserializeString(pReader,local_b8,local_b0,(char **)&local_a8);
        pCVar5 = local_a8;
        if (lVar7 < 0) goto LAB_00160c9e;
        if (pCVar6 != (Colour *)0x0) {
          operator_delete__(pCVar6);
        }
      }
LAB_00160c22:
      local_b8 = local_b8 + local_b0;
      pCVar6 = pCVar5;
    } while (local_b8 <= stop);
    lVar7 = -2;
LAB_00160c9e:
    _Var1._M_head_impl = local_98._M_head_impl;
    if (local_98._M_head_impl != (Projection *)0x0) {
      if ((local_98._M_head_impl)->private_data != (uchar *)0x0) {
        operator_delete__((local_98._M_head_impl)->private_data);
      }
      operator_delete(_Var1._M_head_impl);
    }
LAB_00160cbe:
    pCVar5 = local_a0;
    if (local_a0 != (Colour *)0x0) {
      Colour::~Colour(local_a0);
      operator_delete(pCVar5);
    }
    if (pCVar6 != (Colour *)0x0) {
      operator_delete__(pCVar6);
    }
  }
  return lVar7;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  std::unique_ptr<char[]> colour_space_ptr;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      char* colour_space = NULL;
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
      colour_space_ptr.reset(colour_space);
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space_ptr.release();
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}